

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GetCodeCmdMovHelper(CodeGenRegVmContext *ctx,uchar lhs,uchar rhs,RegVmCopyType copyType)

{
  x86Reg xVar1;
  x86XmmReg xVar2;
  x86Reg sourceReg;
  x86XmmReg sourceReg_2;
  x86Reg sourceReg_1;
  RegVmCopyType copyType_local;
  uchar rhs_local;
  uchar lhs_local;
  CodeGenRegVmContext *ctx_local;
  
  if (copyType == rvcInt) {
    xVar1 = CodeGenGenericContext::FindRegAtMemory
                      (&ctx->ctx,sDWORD,rNONE,1,rEBX,(uint)rhs << 3,true);
    if (xVar1 == rRegCount) {
      xVar1 = CodeGenGenericContext::GetReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,xVar1,sDWORD,rEBX,(uint)rhs << 3);
      CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
                (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
      EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,(uint)lhs << 3,xVar1);
    }
    else {
      CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
                (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
      EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,(uint)lhs << 3,xVar1);
    }
  }
  else if (copyType == rvcDouble) {
    xVar2 = CodeGenGenericContext::FindXmmRegAtMemory
                      (&ctx->ctx,sQWORD,rNONE,1,rEBX,(uint)rhs << 3,true);
    if (xVar2 == rXmmRegCount) {
      xVar2 = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,xVar2,sQWORD,rEBX,(uint)rhs << 3);
      CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
                (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
      EMIT_OP_RPTR_REG(&ctx->ctx,o_movsd,sQWORD,rEBX,(uint)lhs << 3,xVar2);
    }
    else {
      CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
                (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
      EMIT_OP_RPTR_REG(&ctx->ctx,o_movsd,sQWORD,rEBX,(uint)lhs << 3,xVar2);
    }
  }
  else {
    xVar1 = CodeGenGenericContext::FindRegAtMemory
                      (&ctx->ctx,sQWORD,rNONE,1,rEBX,(uint)rhs << 3,true);
    if (xVar1 == rRegCount) {
      xVar1 = CodeGenGenericContext::FindRegAtMemory
                        (&ctx->ctx,sDWORD,rNONE,1,rEBX,(uint)rhs << 3,true);
      if (xVar1 == rRegCount) {
        xVar1 = CodeGenGenericContext::GetReg(&ctx->ctx);
        EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,xVar1,sQWORD,rEBX,(uint)rhs << 3);
        CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
                  (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
        EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,(uint)lhs << 3,xVar1);
      }
      else {
        CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
                  (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
        EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,(uint)lhs << 3,xVar1);
      }
    }
    else {
      CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
                (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
      EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,(uint)lhs << 3,xVar1);
    }
  }
  return;
}

Assistant:

void GetCodeCmdMovHelper(CodeGenRegVmContext &ctx, unsigned char lhs, unsigned char rhs, RegVmCopyType copyType)
{
	if(copyType == rvcInt)
	{
		x86Reg sourceReg = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rREG, rhs * 8, true);

		if(sourceReg != rRegCount)
		{
			ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, lhs * 8, sourceReg); // Store to target
			return;
		}

		sourceReg = ctx.ctx.GetReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, sourceReg, sDWORD, rREG, rhs * 8); // Load source

		ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, lhs * 8, sourceReg); // Store to target
		return;
	}

	if(copyType == rvcDouble)
	{
		x86XmmReg sourceReg = ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, rREG, rhs * 8, true);

		if(sourceReg != rXmmRegCount)
		{
			ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

			EMIT_OP_RPTR_REG(ctx.ctx, o_movsd, sQWORD, rREG, lhs * 8, sourceReg); // Store to target
			return;
		}

		sourceReg = ctx.ctx.GetXmmReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, sourceReg, sQWORD, rREG, rhs * 8); // Load source

		ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

		EMIT_OP_RPTR_REG(ctx.ctx, o_movsd, sQWORD, rREG, lhs * 8, sourceReg); // Store to target
		return;
	}

#if defined(_M_X64)
	x86Reg sourceReg = ctx.ctx.FindRegAtMemory(sQWORD, rNONE, 1, rREG, rhs * 8, true);

	if(sourceReg != rRegCount)
	{
		ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

		EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, lhs * 8, sourceReg); // Store to target
		return;
	}

	// Maybe last write was of dword size
	sourceReg = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rREG, rhs * 8, true);

	if(sourceReg != rRegCount)
	{
		ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, lhs * 8, sourceReg); // Store to target
		return;
	}

	sourceReg = ctx.ctx.GetReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, sourceReg, sQWORD, rREG, rhs * 8); // Load source

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, lhs * 8, sourceReg); // Store to target
#else
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, rhs * 8); // Load source
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, lhs * 8, rEAX); // Store to target

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, rhs * 8 + 4); // Load source
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, lhs * 8 + 4, rEAX); // Store to target
#endif
}